

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

int __thiscall mpt::client::convert(client *this,type_t type,void *ptr)

{
  bool bVar1;
  int iVar2;
  uint8_t *puVar3;
  path local_40;
  
  iVar2 = type_properties<mpt::client_*>::id(true);
  if (iVar2 < 0) {
    iVar2 = 0x100;
  }
  else {
    local_40.base = (char *)this;
    bVar1 = assign<mpt::client*>((client **)&local_40,(int)type,ptr);
    if (bVar1) {
      return 0x85;
    }
  }
  if (type == 0x85) {
    if (ptr == (void *)0x0) {
      return iVar2;
    }
    if (cfg == (convertable *)0x0) {
      path::path(&local_40,(char *)0x0,0x2e,0);
      path::set(&local_40,"mpt.client",-1,-1,-1);
      cfg = &config::global(&local_40)->super_convertable;
      if (cfg == (convertable *)0x0) {
        path::~path(&local_40);
        puVar3 = (uint8_t *)0x0;
        goto LAB_0012dc1f;
      }
      atexit(unrefConfig);
      path::~path(&local_40);
    }
    puVar3 = (uint8_t *)convertable::operator_cast_to_config_(cfg);
  }
  else {
    if (type != 0) {
      if (ptr != (void *)0x0 && (type & 0xffffffff) == 0x100) {
        *(client **)ptr = this;
      }
      if ((int)type != 0x100) {
        return -3;
      }
      return 0x85;
    }
    if (ptr == (void *)0x0) {
      return iVar2;
    }
    puVar3 = convert::fmt;
  }
LAB_0012dc1f:
  *(uint8_t **)ptr = puVar3;
  return iVar2;
}

Assistant:

int client::convert(type_t type, void *ptr)
{
	int me = type_properties<client *>::id(true);
	if (me < 0) {
		me = TypeMetaPtr;
	}
	else if (assign(this, type, ptr)) {
		return TypeConfigPtr;
	}
	if (!type) {
		static const uint8_t fmt[] = { TypeConfigPtr, 0 };
		if (ptr) *static_cast<const uint8_t **>(ptr) = fmt;
		return me;
	}
	int cfg = type_properties<class config *>::id(true);
	if ((cfg > 0) && (type == static_cast<type_t>(cfg))) {
		if (ptr) *static_cast<class config **>(ptr) = clientConfig();
		return me;
	}
	if (assign(static_cast<metatype *>(this), type, ptr)) {
		return TypeConfigPtr;
	}
	return BadType;
}